

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

bool __thiscall
ByteCodeGenerator::NeedCheckBlockVar
          (ByteCodeGenerator *this,Symbol *sym,Scope *scope,FuncInfo *funcInfo)

{
  bool bVar1;
  FuncInfo *pFVar2;
  ParseNode *pPVar3;
  ParseNodeVar *pPVar4;
  bool bVar5;
  bool local_2d;
  bool tdz;
  FuncInfo *funcInfo_local;
  Scope *scope_local;
  Symbol *sym_local;
  ByteCodeGenerator *this_local;
  
  bVar1 = Symbol::GetIsBlockVar(sym);
  bVar5 = false;
  if (bVar1) {
    pFVar2 = Scope::GetFunc(scope);
    bVar5 = true;
    if (pFVar2 == funcInfo) {
      pPVar3 = Symbol::GetDecl(sym);
      if (pPVar3->nop != knopLetDecl) {
        pPVar3 = Symbol::GetDecl(sym);
        bVar5 = false;
        if (pPVar3->nop != knopConstDecl) goto LAB_00b43234;
      }
      pPVar3 = Symbol::GetDecl(sym);
      pPVar4 = ParseNode::AsParseNodeVar(pPVar3);
      bVar5 = pPVar4->isSwitchStmtDecl != '\0';
    }
  }
LAB_00b43234:
  local_2d = true;
  if (!bVar5) {
    local_2d = Symbol::GetIsNonSimpleParameter(sym);
  }
  return local_2d;
}

Assistant:

bool ByteCodeGenerator::NeedCheckBlockVar(Symbol* sym, Scope* scope, FuncInfo* funcInfo) const
{
    bool tdz = sym->GetIsBlockVar()
        && (scope->GetFunc() != funcInfo || ((sym->GetDecl()->nop == knopLetDecl || sym->GetDecl()->nop == knopConstDecl) && sym->GetDecl()->AsParseNodeVar()->isSwitchStmtDecl));

    return tdz || sym->GetIsNonSimpleParameter();
}